

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.h
# Opt level: O0

void __thiscall AC3StreamReader::~AC3StreamReader(AC3StreamReader *this)

{
  AC3StreamReader *this_local;
  
  MemoryBlock::~MemoryBlock(&this->m_delayedAc3Buffer);
  AC3Codec::~AC3Codec(&this->super_AC3Codec);
  SimplePacketizerReader::~SimplePacketizerReader(&this->super_SimplePacketizerReader);
  return;
}

Assistant:

AC3StreamReader() : m_useNewStyleAudioPES(false)
    {
        m_downconvertToAC3 = m_true_hd_mode = false;
        m_state = AC3State::stateDecodeAC3;
        m_waitMoreData = false;

        m_thdDemuxWaitAc3 = true;  // wait ac3 packet
        m_demuxedTHDSamples = 0;
        m_totalTHDSamples = 0;
        m_nextAc3Time = 0;
    }